

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ldmParams_t params_00;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong maxChunkSize;
  ulong uVar5;
  size_t neededSpace;
  size_t ldmSeqSpace;
  size_t ldmSpace;
  size_t matchStateSize;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params *params_local;
  
  if (params->nbWorkers < 1) {
    cParams._20_8_ = params;
    ZSTD_getCParamsFromCCtxParams((ZSTD_compressionParameters *)((long)&blockSize + 4),params,0,0);
    if ((ulong)(1L << (blockSize._4_1_ & 0x3f)) < 0x20001) {
      maxChunkSize = 1L << (blockSize._4_1_ & 0x3f);
    }
    else {
      maxChunkSize = 0x20000;
    }
    uVar1 = 4;
    if (cParams.hashLog == 3) {
      uVar1 = 3;
    }
    uVar5 = maxChunkSize;
    sVar2 = ZSTD_sizeof_matchState((ZSTD_compressionParameters *)((long)&blockSize + 4),1);
    params_00.hashRateLog = (int)uVar5;
    params_00.windowLog = (int)(uVar5 >> 0x20);
    params_00._0_16_ = *(undefined1 (*) [16])(cParams._20_8_ + 0x58);
    sVar3 = ZSTD_ldm_getTableSize(params_00);
    sVar4 = ZSTD_ldm_getMaxNbSeq(*(ldmParams_t *)(cParams._20_8_ + 0x50),maxChunkSize);
    params_local = (ZSTD_CCtx_params *)
                   (maxChunkSize + (maxChunkSize / uVar1) * 0xb + sVar2 + sVar3 + sVar4 * 0xc +
                   0x3fc0);
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    /* Estimate CCtx size is supported for single-threaded compression only. */
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, 0, 0);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        U32    const divider = (cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = WILDCOPY_OVERLENGTH + blockSize + 11*maxNbSeq;
        size_t const entropySpace = HUF_WORKSPACE_SIZE;
        size_t const blockStateSpace = 2 * sizeof(ZSTD_compressedBlockState_t);
        size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 1);

        size_t const ldmSpace = ZSTD_ldm_getTableSize(params->ldmParams);
        size_t const ldmSeqSpace = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize) * sizeof(rawSeq);

        size_t const neededSpace = entropySpace + blockStateSpace + tokenSpace +
                                   matchStateSize + ldmSpace + ldmSeqSpace;

        DEBUGLOG(5, "sizeof(ZSTD_CCtx) : %u", (U32)sizeof(ZSTD_CCtx));
        DEBUGLOG(5, "estimate workSpace : %u", (U32)neededSpace);
        return sizeof(ZSTD_CCtx) + neededSpace;
    }
}